

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

void __thiscall siamese::EncoderPacketWindow::RemoveElements(EncoderPacketWindow *this)

{
  ostringstream *this_00;
  EncoderSubwindow **ppEVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  bool bVar4;
  int iVar5;
  OutputWorker *this_01;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint elementStart;
  uint sumIndex;
  uint uVar9;
  long lVar10;
  EncoderColumnLane *pEVar11;
  uint uVar12;
  uint laneIndex;
  long lVar13;
  uint laneLongest [8];
  undefined1 local_1b8 [392];
  
  uVar8 = this->FirstUnremovedElement;
  if (DAT_002087e8 < 3) {
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,DAT_00208818,DAT_00208820)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"******** Removing up to ",0x18);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," and startColumn=",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  uVar12 = uVar8 >> 6;
  uVar8 = uVar8 & 0xffffffc0;
  if (this->SumStartElement < this->SumEndElement) {
    pEVar11 = this->Lanes;
    lVar13 = 0;
    do {
      lVar10 = 0;
      do {
        GetSum(this,(uint)lVar13,(uint)lVar10,uVar8);
        pEVar11->NextElement[lVar10] = pEVar11->NextElement[lVar10] - uVar8;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar13 = lVar13 + 1;
      pEVar11 = pEVar11 + 1;
    } while (lVar13 != 8);
    uVar9 = this->SumStartElement;
    if (uVar9 <= uVar8 && uVar8 - uVar9 != 0) {
      this->SumErasedCount = this->SumErasedCount + (uVar8 - uVar9);
    }
    uVar6 = this->SumEndElement - uVar8;
    if (this->SumEndElement < uVar8) {
      uVar6 = 0;
    }
    uVar7 = uVar9 - uVar8;
    if (uVar9 < uVar8) {
      uVar7 = 0;
    }
    this->SumEndElement = uVar6;
    this->SumStartElement = uVar7;
  }
  bVar4 = pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
                    (&this->SubwindowsShift,uVar12);
  if (bVar4) {
    memcpy((this->SubwindowsShift).DataPtr,(this->Subwindows).DataPtr,(ulong)(uVar12 * 8));
    ppEVar1 = (this->Subwindows).DataPtr;
    uVar9 = (this->Subwindows).Size - uVar12;
    memmove(ppEVar1,ppEVar1 + uVar12,(ulong)uVar9 * 8);
    memcpy((this->Subwindows).DataPtr + (int)uVar9,(this->SubwindowsShift).DataPtr,
           (ulong)(uVar12 * 8));
    uVar12 = this->Count;
    uVar9 = this->FirstUnremovedElement;
    uVar6 = 0;
    uVar7 = uVar12 - uVar8;
    elementStart = uVar9 - uVar8;
    this->Count = uVar7;
    this->ColumnStart = uVar8 + this->ColumnStart & 0x3fffff;
    this->FirstUnremovedElement = elementStart;
    local_1b8._0_8_ = (char *)0x0;
    local_1b8._8_4_ = Trace;
    local_1b8._12_4_ = 0;
    local_1b8._16_8_ = 0;
    local_1b8._24_8_ = 0;
    if (elementStart < uVar7) {
      ppEVar1 = (this->Subwindows).DataPtr;
      iVar5 = uVar12 - uVar9;
      uVar6 = 0;
      uVar8 = elementStart;
      do {
        uVar12 = (ppEVar1[uVar8 >> 6]->Originals)._M_elems[uVar8 & 0x3f].Buffer.Bytes;
        if (uVar6 <= uVar12) {
          uVar6 = uVar12;
        }
        uVar9 = uVar8 & 7;
        if (uVar12 < *(uint *)(local_1b8 + (ulong)uVar9 * 4)) {
          uVar12 = *(uint *)(local_1b8 + (ulong)uVar9 * 4);
        }
        uVar8 = uVar8 + 1;
        iVar5 = iVar5 + -1;
        *(uint *)(local_1b8 + (ulong)uVar9 * 4) = uVar12;
      } while (iVar5 != 0);
    }
    this->LongestPacket = uVar6;
    auVar2 = vpmovsxwd_avx2(_DAT_001b3b80);
    auVar3._8_4_ = local_1b8._8_4_;
    auVar3._0_8_ = local_1b8._0_8_;
    auVar3._12_4_ = local_1b8._12_4_;
    auVar3._16_8_ = local_1b8._16_8_;
    auVar3._24_8_ = local_1b8._24_8_;
    vpscatterdd_avx512vl(ZEXT832(this) + ZEXT832(0x158) + auVar2,0xffff,auVar3);
    if (this->SumEndElement <= this->SumStartElement) {
      ResetSums(this,elementStart);
    }
  }
  else {
    this->EmergencyDisabled = true;
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveElements()
{
    const unsigned firstKeptSubwindow  = FirstUnremovedElement / kSubwindowSize;
    const unsigned removedElementCount = firstKeptSubwindow * kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow >= 1);
    SIAMESE_DEBUG_ASSERT(firstKeptSubwindow < Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(removedElementCount % kColumnLaneCount == 0);
    SIAMESE_DEBUG_ASSERT(removedElementCount <= FirstUnremovedElement);

    Logger.Info("******** Removing up to ", FirstUnremovedElement, " and startColumn=", ColumnStart);

    // If there are running sums:
    if (SumEndElement > SumStartElement)
    {
        // Roll up the sums past the removal point
        for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
        {
            for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
            {
                GetSum(laneIndex, sumIndex, removedElementCount);

                SIAMESE_DEBUG_ASSERT(Lanes[laneIndex].NextElement[sumIndex] >= removedElementCount);
                Lanes[laneIndex].NextElement[sumIndex] -= removedElementCount;
            }
        }

        if (removedElementCount > SumStartElement) {
            SumErasedCount += removedElementCount - SumStartElement;
        }

        if (SumEndElement > removedElementCount) {
            SumEndElement -= removedElementCount;
        }
        else {
            SumEndElement = 0;
        }

        if (SumStartElement > removedElementCount) {
            SumStartElement -= removedElementCount;
        }
        else {
            SumStartElement = 0;
        }
    }

    // Shift kept subwindows to the front of the vector:

    // Resize a temporary buffer for removed subwindows
    if (!SubwindowsShift.SetSize_NoCopy(firstKeptSubwindow))
    {
        SIAMESE_DEBUG_BREAK(); // OOM
        EmergencyDisabled = true;
        return;
    }

    // Store removed subwindows temporarily
    memcpy(
        SubwindowsShift.GetPtr(0),
        Subwindows.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    const unsigned subwindowsShifted = Subwindows.GetSize() - firstKeptSubwindow;

    // Shift subwindows to front that are being kept
    memmove(
        Subwindows.GetPtr(0),
        Subwindows.GetPtr(firstKeptSubwindow),
        subwindowsShifted * sizeof(EncoderSubwindow*)
    );

    // Removed subwindows are moved to the end (unordered) for later reuse
    memcpy(
        Subwindows.GetPtr(subwindowsShifted),
        SubwindowsShift.GetPtr(0),
        firstKeptSubwindow * sizeof(EncoderSubwindow*)
    );

    // Update the count of elements in the window
    SIAMESE_DEBUG_ASSERT(Count >= removedElementCount);
    Count -= removedElementCount;

    // Roll up the ColumnStart member
    ColumnStart = ElementToColumn(removedElementCount);
    SIAMESE_DEBUG_ASSERT(ColumnStart == Subwindows.GetRef(0)->Originals[0].Column);

    // Roll up the FirstUnremovedElement member
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement % kSubwindowSize == FirstUnremovedElement - removedElementCount);
    SIAMESE_DEBUG_ASSERT(FirstUnremovedElement >= removedElementCount);
    FirstUnremovedElement -= removedElementCount;

    // Determine the new longest packets
    unsigned longestPacket = 0;
    unsigned laneLongest[kColumnLaneCount] = { 0 };
    for (unsigned i = FirstUnremovedElement, count = Count; i < count; ++i)
    {
        OriginalPacket* original     = GetWindowElement(i);
        const unsigned originalBytes = original->Buffer.Bytes;
        if (longestPacket < originalBytes) {
            longestPacket = originalBytes;
        }
        SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == i % kColumnLaneCount);
        const unsigned laneIndex = i % kColumnLaneCount;
        if (laneLongest[laneIndex] < originalBytes) {
            laneLongest[laneIndex] = originalBytes;
        }
    }

    // Update longest packet fields
    LongestPacket = longestPacket;
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex) {
        Lanes[laneIndex].LongestPacket = laneLongest[laneIndex];
    }

    // If there are no running sums:
    if (SumEndElement <= SumStartElement) {
        ResetSums(FirstUnremovedElement);
    }
}